

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I422ToRGB565Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_rgb565,
                      YuvConstants *yuvconstants,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int br;
  int bg;
  int bb;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar4 = yuvconstants->kYToRgb[0] * 0x101;
    iVar15 = 0;
    do {
      uVar13 = (uint)*src_y * iVar4 >> 0x10;
      iVar11 = (int)sVar1 - (int)yuvconstants->kUVToB[0] * (uint)*src_u;
      uVar5 = (int)(iVar11 + uVar13) >> 6;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      iVar8 = (int)sVar2 -
              ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
              (int)yuvconstants->kUVToG[0] * (uint)*src_u);
      iVar14 = iVar8 + uVar13;
      if (iVar14 >> 6 < 1) {
        iVar14 = 0;
      }
      uVar10 = iVar14 >> 6;
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar14 = (int)sVar3 - (int)yuvconstants->kUVToR[1] * (uint)*src_v;
      uVar13 = (int)(uVar13 + iVar14) >> 6;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      if (0xfe < (int)uVar13) {
        uVar13 = 0xff;
      }
      uVar7 = (uint)src_y[1] * iVar4 >> 0x10;
      uVar12 = (int)(iVar11 + uVar7) >> 6;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      if (0xfe < (int)uVar12) {
        uVar12 = 0xff;
      }
      iVar8 = iVar8 + uVar7;
      if (iVar8 >> 6 < 1) {
        iVar8 = 0;
      }
      uVar9 = iVar8 >> 6;
      if (0xfe < (int)uVar9) {
        uVar9 = 0xff;
      }
      uVar7 = (int)(uVar7 + iVar14) >> 6;
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if (0xfe < (int)uVar7) {
        uVar7 = 0xff;
      }
      *(uint *)dst_rgb565 =
           (uVar7 & 0xfffffff8) << 0x18 | (uVar9 & 0xfc) << 0x13 |
           (uVar12 & 0xf8) << 0xd | (uVar13 & 0xf8) << 8 | (uVar5 >> 3) + (uVar10 & 0xfc) * 8;
      src_y = src_y + 2;
      src_u = src_u + 1;
      src_v = src_v + 1;
      dst_rgb565 = (uint8_t *)((long)dst_rgb565 + 4);
      iVar15 = iVar15 + 2;
    } while (iVar15 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar13 = (int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10;
    uVar5 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_u) +
                 uVar13) >> 6;
    uVar10 = 0;
    if ((int)uVar5 < 1) {
      uVar5 = uVar10;
    }
    uVar6 = (ushort)uVar5;
    if (0xfe < (int)uVar5) {
      uVar6 = 0xff;
    }
    uVar5 = (int)(((int)yuvconstants->kUVBiasG[0] -
                  ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
                  (int)yuvconstants->kUVToG[0] * (uint)*src_u)) + uVar13) >> 6;
    if ((int)uVar5 < 1) {
      uVar5 = uVar10;
    }
    if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
    uVar13 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)*src_v) +
                  uVar13) >> 6;
    if ((int)uVar13 < 1) {
      uVar13 = uVar10;
    }
    if (0xfe < (int)uVar13) {
      uVar13 = 0xff;
    }
    *(ushort *)dst_rgb565 =
         (ushort)((uVar13 & 0xfffffff8) << 8) | (ushort)((uVar5 & 0xfc) << 3) | uVar6 >> 3;
  }
  return;
}

Assistant:

void I422ToRGB565Row_C(const uint8_t* src_y,
                       const uint8_t* src_u,
                       const uint8_t* src_v,
                       uint8_t* dst_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 2;
    r1 = r1 >> 3;
    *(uint32_t*)(dst_rgb565) =
        b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) | (r1 << 27);
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_rgb565 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    *(uint16_t*)(dst_rgb565) = b0 | (g0 << 5) | (r0 << 11);
  }
}